

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void anon_unknown.dwarf_18f9de::ExpectBerConvert
               (char *name,Span<const_unsigned_char> der_expected,Span<const_unsigned_char> ber)

{
  int iVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar4;
  size_t sVar5;
  char *pcVar6;
  char *in_R9;
  pointer *__ptr;
  ScopedTrace gtest_trace_623;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> scoper;
  uint8_t *storage;
  CBS out;
  CBS in;
  ScopedTrace local_91;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  Bytes local_80;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_50;
  _Head_base<0UL,_unsigned_char_*,_false> local_48;
  CBS local_40;
  CBS local_30;
  
  sVar5 = ber.size_;
  plVar2 = (long *)ber.data_;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)der_expected.size_;
  uVar4._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )der_expected.data_;
  testing::ScopedTrace::ScopedTrace
            (&local_91,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
             ,0x26f,name);
  local_30.data = (uint8_t *)plVar2;
  local_30.len = sVar5;
  iVar1 = CBS_asn1_ber_to_der(&local_30,&local_40,&local_48._M_head_impl);
  local_90[0] = iVar1 != 0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)local_90,
               (AssertionResult *)"CBS_asn1_ber_to_der(&in, &out, &storage)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x274,(char *)CONCAT71(local_70._1_7_,local_70[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._1_7_,local_70[0]) != &local_60) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_70._1_7_,local_70[0]),local_60._M_allocated_capacity + 1);
    }
    if ((long *)local_80.span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_80.span_.data_ + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    goto LAB_0021e797;
  }
  local_50._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)local_48._M_head_impl;
  local_80.span_.data_ = local_40.data;
  local_80.span_.size_ = local_40.len;
  local_90 = (undefined1  [8])
             uVar4._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  local_88 = pbVar3;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            ((internal *)local_70,"Bytes(der_expected)","Bytes(CBS_data(&out), CBS_len(&out))",
             (Bytes *)local_90,&local_80);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x277,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_90 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_90 + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  local_80.span_.data_ = (uchar *)plVar2;
  local_80.span_.size_ = sVar5;
  if (local_48._M_head_impl == (uchar *)0x0) {
    local_90 = (undefined1  [8])
               uVar4._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_88 = pbVar3;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_70,"Bytes(der_expected)","Bytes(ber)",(Bytes *)local_90,&local_80);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_90);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x27b,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_90);
      goto LAB_0021e75f;
    }
  }
  else {
    local_90 = (undefined1  [8])
               uVar4._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    local_88 = pbVar3;
    testing::internal::CmpHelperNE<Bytes,Bytes>
              ((internal *)local_70,"Bytes(der_expected)","Bytes(ber)",(Bytes *)local_90,&local_80);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_90);
      if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = (local_68->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x279,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_90);
LAB_0021e75f:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
      if (local_90 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_90 + 8))();
      }
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_50);
LAB_0021e797:
  testing::ScopedTrace::~ScopedTrace(&local_91);
  return;
}

Assistant:

static void ExpectBerConvert(const char *name,
                             bssl::Span<const uint8_t> der_expected,
                             bssl::Span<const uint8_t> ber) {
  SCOPED_TRACE(name);
  CBS in, out;
  uint8_t *storage;

  CBS_init(&in, ber.data(), ber.size());
  ASSERT_TRUE(CBS_asn1_ber_to_der(&in, &out, &storage));
  bssl::UniquePtr<uint8_t> scoper(storage);

  EXPECT_EQ(Bytes(der_expected), Bytes(CBS_data(&out), CBS_len(&out)));
  if (storage != nullptr) {
    EXPECT_NE(Bytes(der_expected), Bytes(ber));
  } else {
    EXPECT_EQ(Bytes(der_expected), Bytes(ber));
  }
}